

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

string * __thiscall iDynTree::Model::getFrameName_abi_cxx11_(Model *this,FrameIndex frameIndex)

{
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  Model *this_00;
  char *pcVar6;
  size_type in_RDX;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  Model *in_stack_fffffffffffffde0;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  size_type local_18;
  
  local_18 = in_RDX;
  if ((-1 < (long)in_RDX) && (sVar3 = getNrOfLinks((Model *)0x44833b), (long)in_RDX < (long)sVar3))
  {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x68),local_18);
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar4);
    return in_RDI;
  }
  sVar1 = local_18;
  sVar3 = getNrOfLinks((Model *)0x448387);
  sVar2 = local_18;
  if (((long)sVar3 <= (long)sVar1) &&
     (sVar3 = getNrOfFrames(in_stack_fffffffffffffde0), (long)sVar2 < (long)sVar3)) {
    sVar3 = getNrOfLinks((Model *)0x4483dd);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x98),local_18 - sVar3);
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar4);
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar5 = std::operator<<(local_190,"frameIndex ");
  this_00 = (Model *)std::ostream::operator<<(poVar5,local_18);
  poVar5 = std::operator<<((ostream *)this_00," is not valid, should be between 0 and ");
  sVar3 = getNrOfFrames(this_00);
  std::ostream::operator<<(poVar5,sVar3 - 1);
  std::__cxx11::stringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iDynTree::reportError("Model","getFrameName",pcVar6);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::string((string *)in_RDI,(string *)FRAME_INVALID_NAME_abi_cxx11_);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string Model::getFrameName(const FrameIndex frameIndex) const
{
    if( frameIndex >= 0 && frameIndex < (FrameIndex)this->getNrOfLinks() )
    {
        return linkNames[frameIndex];
    }
    else if( frameIndex >= (FrameIndex)this->getNrOfLinks() && frameIndex < (FrameIndex)this->getNrOfFrames() )
    {
        return frameNames[frameIndex-getNrOfLinks()];
    }
    else
    {
        std::stringstream ss;
        ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
        reportError("Model","getFrameName",ss.str().c_str());
        return FRAME_INVALID_NAME;
    }
}